

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.h
# Opt level: O2

Nonnull<char_*>
absl::lts_20250127::numbers_internal::FastIntToBuffer<short>(short i,Nonnull<char_*> buffer)

{
  ulong uVar1;
  uint64_t uVar2;
  long *plVar3;
  uint i_00;
  undefined6 in_register_0000003a;
  
  i_00 = (uint)CONCAT62(in_register_0000003a,i);
  if ((int)i_00 < 0) {
    *buffer = '-';
    buffer = buffer + 1;
    i_00 = -i_00;
  }
  if (i_00 < 10) {
    *buffer = (byte)i_00 | 0x30;
    plVar3 = (long *)((long)buffer + 1);
  }
  else {
    if (i_00 < 100000000) {
      uVar2 = anon_unknown_0::PrepareEightDigits(i_00);
      if (uVar2 == 0) {
        __assert_fail("bottom != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/numbers.cc"
                      ,0xf5,
                      "absl::Nonnull<char *> absl::lts_20250127::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                     );
      }
      uVar1 = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      *(uint64_t *)buffer = uVar2 + 0x3030303030303030 >> ((byte)uVar1 & 0x38);
      plVar3 = (long *)((long)buffer - (uVar1 >> 3 & 0x1fffffff));
    }
    else {
      uVar2 = anon_unknown_0::PrepareEightDigits(i_00 % 100000000);
      plVar3 = (long *)anon_unknown_0::EncodeHundred(i_00 / 100000000,buffer);
      *plVar3 = uVar2 + 0x3030303030303030;
    }
    plVar3 = plVar3 + 1;
  }
  *(char *)plVar3 = '\0';
  return (Nonnull<char_*>)plVar3;
}

Assistant:

ABSL_INTERNAL_NEED_MIN_SIZE(buffer, kFastToBufferSize) {
  static_assert(sizeof(i) <= 64 / 8,
                "FastIntToBuffer works only with 64-bit-or-less integers.");
  // TODO(jorg): This signed-ness check is used because it works correctly
  // with enums, and it also serves to check that int_type is not a pointer.
  // If one day something like std::is_signed<enum E> works, switch to it.
  // These conditions are constexpr bools to suppress MSVC warning C4127.
  constexpr bool kIsSigned = static_cast<int_type>(1) - 2 < 0;
  constexpr bool kUse64Bit = sizeof(i) > 32 / 8;
  if (kIsSigned) {
    if (kUse64Bit) {
      return FastIntToBuffer(static_cast<int64_t>(i), buffer);
    } else {
      return FastIntToBuffer(static_cast<int32_t>(i), buffer);
    }
  } else {
    if (kUse64Bit) {
      return FastIntToBuffer(static_cast<uint64_t>(i), buffer);
    } else {
      return FastIntToBuffer(static_cast<uint32_t>(i), buffer);
    }
  }
}